

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O0

bool __thiscall tcmalloc::PageHeap::CheckExpensive(PageHeap *this)

{
  bool bVar1;
  uint local_18;
  int s;
  bool result;
  PageHeap *this_local;
  
  bVar1 = Check(this);
  CheckSet(this,&this->large_normal_,0x81,1);
  CheckSet(this,&this->large_returned_,0x81,2);
  for (local_18 = 1; local_18 < 0x81; local_18 = local_18 + 1) {
    CheckList(this,&this->free_[(int)(local_18 - 1)].normal,(long)(int)local_18,(long)(int)local_18,
              1);
    CheckList(this,(Span *)(Static::pageheap_ +
                           (long)((this->pagemap_cache_).array_ +
                                 (long)(int)(local_18 - 1) * 0xc + 0x254)),(long)(int)local_18,
              (long)(int)local_18,2);
  }
  return bVar1;
}

Assistant:

bool PageHeap::CheckExpensive() {
  bool result = Check();
  CheckSet(&large_normal_, kMaxPages + 1, Span::ON_NORMAL_FREELIST);
  CheckSet(&large_returned_, kMaxPages + 1, Span::ON_RETURNED_FREELIST);
  for (int s = 1; s <= kMaxPages; s++) {
    CheckList(&free_[s - 1].normal, s, s, Span::ON_NORMAL_FREELIST);
    CheckList(&free_[s - 1].returned, s, s, Span::ON_RETURNED_FREELIST);
  }
  return result;
}